

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

void __thiscall sector_t::ClosestPoint(sector_t *this,DVector2 *in,DVector2 *out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  TVector2<double> local_b0;
  double local_a0;
  double u;
  double num;
  double dist;
  double iy;
  double ix;
  double den;
  double b;
  double a;
  vertex_t *v2;
  vertex_t *v1;
  double besty;
  double bestx;
  double bestdist;
  double y;
  double x;
  DVector2 *pDStack_20;
  int i;
  DVector2 *out_local;
  DVector2 *in_local;
  sector_t *this_local;
  
  y = in->X;
  bestdist = in->Y;
  bestx = INFINITY;
  besty = 0.0;
  v1 = (vertex_t *)0x0;
  pDStack_20 = out;
  out_local = in;
  in_local = (DVector2 *)this;
  for (x._4_4_ = 0; x._4_4_ < this->linecount; x._4_4_ = x._4_4_ + 1) {
    v2 = this->lines[x._4_4_]->v1;
    a = (double)this->lines[x._4_4_]->v2;
    dVar1 = vertex_t::fX((vertex_t *)a);
    dVar2 = vertex_t::fX(v2);
    b = dVar1 - dVar2;
    dVar2 = vertex_t::fY((vertex_t *)a);
    dVar3 = vertex_t::fY(v2);
    dVar1 = y;
    den = dVar2 - dVar3;
    ix = b * b + den * den;
    if ((ix != 0.0) || (NAN(ix))) {
      dVar3 = vertex_t::fX(v2);
      dVar2 = bestdist;
      dVar1 = (dVar1 - dVar3) * b;
      dVar3 = vertex_t::fY(v2);
      u = dVar1 + (dVar2 - dVar3) * den;
      local_a0 = u / ix;
      if (0.0 < local_a0) {
        if (local_a0 < 1.0) {
          dVar1 = vertex_t::fX(v2);
          iy = dVar1 + local_a0 * b;
          dVar1 = vertex_t::fY(v2);
          dist = dVar1 + local_a0 * den;
        }
        else {
          iy = vertex_t::fX((vertex_t *)a);
          dist = vertex_t::fY((vertex_t *)a);
        }
      }
      else {
        iy = vertex_t::fX(v2);
        dist = vertex_t::fY(v2);
      }
    }
    else {
      iy = vertex_t::fX(v2);
      dist = vertex_t::fY(v2);
    }
    b = iy - y;
    den = dist - bestdist;
    num = b * b + den * den;
    if (num < bestx) {
      besty = iy;
      v1 = (vertex_t *)dist;
      bestx = num;
    }
  }
  TVector2<double>::TVector2(&local_b0,besty,(double)v1);
  TVector2<double>::operator=(pDStack_20,&local_b0);
  return;
}

Assistant:

void sector_t::ClosestPoint(const DVector2 &in, DVector2 &out) const
{
	int i;
	double x = in.X, y = in.Y;
	double bestdist = HUGE_VAL;
	double bestx = 0, besty = 0;

	for (i = 0; i < linecount; ++i)
	{
		vertex_t *v1 = lines[i]->v1;
		vertex_t *v2 = lines[i]->v2;
		double a = v2->fX() - v1->fX();
		double b = v2->fY() - v1->fY();
		double den = a*a + b*b;
		double ix, iy, dist;

		if (den == 0)
		{ // Line is actually a point!
			ix = v1->fX();
			iy = v1->fY();
		}
		else
		{
			double num = (x - v1->fX()) * a + (y - v1->fY()) * b;
			double u = num / den;
			if (u <= 0)
			{
				ix = v1->fX();
				iy = v1->fY();
			}
			else if (u >= 1)
			{
				ix = v2->fX();
				iy = v2->fY();
			}
			else
			{
				ix = v1->fX() + u * a;
				iy = v1->fY() + u * b;
			}
		}
		a = (ix - x);
		b = (iy - y);
		dist = a*a + b*b;
		if (dist < bestdist)
		{
			bestdist = dist;
			bestx = ix;
			besty = iy;
		}
	}
	out = { bestx, besty };
}